

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O2

void __thiscall duckdb::ARTMerger::MergeInlined(ARTMerger *this,NodeEntry *entry)

{
  uint8_t byte;
  uint8_t byte_00;
  idx_t start;
  reference<Node> node_00;
  idx_t iVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  ulong value;
  ulong value_00;
  bool status;
  reference<Node> node;
  ARTKey left_key;
  ARTKey right_key;
  reference<Node> local_60;
  NodeEntry *local_58;
  ARTKey local_50;
  ARTKey local_40;
  
  status = entry->status == GATE_NOT_SET;
  if (status) {
    entry->depth = 0;
  }
  value = (entry->left->super_IndexPointer).data & 0xffffffffffffff;
  value_00 = (entry->right->super_IndexPointer).data & 0xffffffffffffff;
  local_50 = ARTKey::CreateARTKey<long>(&this->arena,value);
  pdVar2 = local_50.data;
  local_40 = ARTKey::CreateARTKey<long>(&this->arena,value_00);
  pdVar3 = local_40.data;
  start = entry->depth;
  iVar1 = ARTKey::GetMismatchPos(&local_50,&local_40,start);
  local_60._M_data = entry->left;
  ((local_60._M_data)->super_IndexPointer).data = 0;
  local_58 = entry;
  if (iVar1 - start != 0) {
    Prefix::New(this->art,&local_60,&local_50,start,iVar1 - start);
  }
  node_00._M_data = local_60._M_data;
  byte = pdVar2[iVar1];
  byte_00 = pdVar3[iVar1];
  if (iVar1 == 7) {
    BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::New(this->art,local_60._M_data);
    Node7Leaf::InsertByte(this->art,node_00._M_data,byte);
    Node7Leaf::InsertByte(this->art,node_00._M_data,byte_00);
  }
  else {
    BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(this->art,local_60._M_data);
    Node4::InsertChild(this->art,node_00._M_data,byte,(Node)(value | 0x700000000000000));
    Node4::InsertChild(this->art,node_00._M_data,byte_00,(Node)(value_00 | 0x700000000000000));
  }
  Node::SetGateStatus(local_58->left,status);
  return;
}

Assistant:

void ARTMerger::MergeInlined(NodeEntry &entry) {
	D_ASSERT(entry.left.GetType() == NType::LEAF_INLINED);
	D_ASSERT(entry.right.GetType() == NType::LEAF_INLINED);

	auto new_status = GateStatus::GATE_NOT_SET;
	if (entry.status == GateStatus::GATE_NOT_SET) {
		// Case 1: We are outside a nested leaf,
		// so we create a nested leaf.
		new_status = GateStatus::GATE_SET;
		entry.depth = 0;
	}
	// Otherwise, case 2: we are in a nested leaf with two 'compressed' prefixes.
	// A 'compressed prefix' is an inlined leaf that could've been expanded to
	// a prefix with an inlined leaf as its only child.

	// Get the corresponding row IDs and their ART keys.
	auto left_row_id = entry.left.GetRowId();
	auto right_row_id = entry.right.GetRowId();
	auto left_key = ARTKey::CreateARTKey<row_t>(arena, left_row_id);
	auto right_key = ARTKey::CreateARTKey<row_t>(arena, right_row_id);

	auto pos = left_key.GetMismatchPos(right_key, entry.depth);

	entry.left.Clear();
	reference<Node> node(entry.left);
	if (pos != entry.depth) {
		// The row IDs share a prefix.
		Prefix::New(art, node, left_key, entry.depth, pos - entry.depth);
	}

	auto left_byte = left_key.data[pos];
	auto right_byte = right_key.data[pos];

	if (pos == Prefix::ROW_ID_COUNT) {
		// The row IDs differ on the last byte.
		Node7Leaf::New(art, node);
		Node7Leaf::InsertByte(art, node, left_byte);
		Node7Leaf::InsertByte(art, node, right_byte);
		entry.left.SetGateStatus(new_status);
		return;
	}

	// Create and insert the (compressed) children.
	// We inline directly into the node, instead of creating prefixes
	// with a single inlined leaf as their child.
	Node4::New(art, node);

	Node left_child;
	Leaf::New(left_child, left_row_id);
	Node4::InsertChild(art, node, left_byte, left_child);

	Node right_child;
	Leaf::New(right_child, right_row_id);
	Node4::InsertChild(art, node, right_byte, right_child);

	entry.left.SetGateStatus(new_status);
}